

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O3

bool __thiscall
cmStringCommand::RegexMatch
          (cmStringCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *delimiter;
  bool bVar1;
  long *plVar2;
  size_type *psVar3;
  pointer pbVar4;
  string output;
  string input;
  string e_1;
  RegularExpression re;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  string local_158;
  undefined1 local_138 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  RegularExpression local_f8;
  
  pbVar4 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  cmMakefile::ClearMatches((this->super_cmCommand).Makefile);
  local_f8.regmatch.startp[0] = (char *)0x0;
  local_f8.regmatch.endp[0] = (char *)0x0;
  local_f8.regmatch.searchstring = (char *)0x0;
  local_f8.program = (char *)0x0;
  bVar1 = cmsys::RegularExpression::compile(&local_f8,pbVar4[2]._M_dataplus._M_p);
  if (!bVar1) {
    std::operator+(&local_178,"sub-command REGEX, mode MATCH failed to compile regex \"",pbVar4 + 2)
    ;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_178);
    psVar3 = (size_type *)(plVar2 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar2 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar3) {
      local_158.field_2._M_allocated_capacity = *psVar3;
      local_158.field_2._8_8_ = plVar2[3];
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    }
    else {
      local_158.field_2._M_allocated_capacity = *psVar3;
      local_158._M_dataplus._M_p = (pointer)*plVar2;
    }
    local_158._M_string_length = plVar2[1];
    *plVar2 = (long)psVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p,
                      CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,
                               local_178.field_2._M_local_buf[0]) + 1);
    }
    cmCommand::SetError(&this->super_cmCommand,&local_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    bVar1 = false;
    goto LAB_001eb5f0;
  }
  local_138._8_8_ =
       (args->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  local_138._0_8_ =
       (args->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start + 4;
  delimiter = &local_178.field_2;
  local_178._M_string_length = 0;
  local_178.field_2._M_local_buf[0] = '\0';
  local_178._M_dataplus._M_p = (pointer)delimiter;
  cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
            (&local_158,
             (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)local_138,delimiter->_M_local_buf);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != delimiter) {
    operator_delete(local_178._M_dataplus._M_p,
                    CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,
                             local_178.field_2._M_local_buf[0]) + 1);
  }
  local_178._M_string_length = 0;
  local_178.field_2._M_local_buf[0] = '\0';
  local_178._M_dataplus._M_p = (pointer)delimiter;
  bVar1 = cmsys::RegularExpression::find(&local_f8,local_158._M_dataplus._M_p,&local_f8.regmatch);
  if (bVar1) {
    cmMakefile::StoreMatches((this->super_cmCommand).Makefile,&local_f8);
    if (local_f8.regmatch.endp[0] != local_f8.regmatch.startp[0]) {
      std::__cxx11::string::substr((ulong)local_138,(ulong)&local_158);
      std::__cxx11::string::operator=((string *)&local_178,(string *)local_138);
      if ((pointer)local_138._0_8_ != (pointer)(local_138 + 0x10)) {
        operator_delete((void *)local_138._0_8_,(ulong)(local_138._16_8_ + 1));
      }
      goto LAB_001eb4f8;
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_118,
                   "sub-command REGEX, mode MATCH regex \"",pbVar4 + 2);
    plVar2 = (long *)std::__cxx11::string::append(local_118._M_local_buf);
    pbVar4 = (pointer)(plVar2 + 2);
    if ((pointer)*plVar2 == pbVar4) {
      local_138._16_8_ = (pbVar4->_M_dataplus)._M_p;
      local_138._24_8_ = plVar2[3];
      local_138._0_8_ = (pointer)(local_138 + 0x10);
    }
    else {
      local_138._16_8_ = (pbVar4->_M_dataplus)._M_p;
      local_138._0_8_ = (pointer)*plVar2;
    }
    local_138._8_8_ = plVar2[1];
    *plVar2 = (long)pbVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_allocated_capacity != &local_108) {
      operator_delete((void *)local_118._M_allocated_capacity,local_108._M_allocated_capacity + 1);
    }
    cmCommand::SetError(&this->super_cmCommand,(string *)local_138);
    if ((pointer)local_138._0_8_ != (pointer)(local_138 + 0x10)) {
      operator_delete((void *)local_138._0_8_,(ulong)(local_138._16_8_ + 1));
    }
    bVar1 = false;
  }
  else {
LAB_001eb4f8:
    bVar1 = true;
    cmMakefile::AddDefinition
              ((this->super_cmCommand).Makefile,pbVar4 + 3,local_178._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != delimiter) {
    operator_delete(local_178._M_dataplus._M_p,
                    CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,
                             local_178.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
LAB_001eb5f0:
  if (local_f8.program != (char *)0x0) {
    operator_delete__(local_f8.program);
  }
  return bVar1;
}

Assistant:

bool cmStringCommand::RegexMatch(std::vector<std::string> const& args)
{
  //"STRING(REGEX MATCH <regular_expression> <output variable>
  // <input> [<input>...])\n";
  std::string const& regex = args[2];
  std::string const& outvar = args[3];

  this->Makefile->ClearMatches();
  // Compile the regular expression.
  cmsys::RegularExpression re;
  if (!re.compile(regex.c_str())) {
    std::string e =
      "sub-command REGEX, mode MATCH failed to compile regex \"" + regex +
      "\".";
    this->SetError(e);
    return false;
  }

  // Concatenate all the last arguments together.
  std::string input = cmJoin(cmMakeRange(args).advance(4), std::string());

  // Scan through the input for all matches.
  std::string output;
  if (re.find(input)) {
    this->Makefile->StoreMatches(re);
    std::string::size_type l = re.start();
    std::string::size_type r = re.end();
    if (r - l == 0) {
      std::string e = "sub-command REGEX, mode MATCH regex \"" + regex +
        "\" matched an empty string.";
      this->SetError(e);
      return false;
    }
    output = input.substr(l, r - l);
  }

  // Store the output in the provided variable.
  this->Makefile->AddDefinition(outvar, output.c_str());
  return true;
}